

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.cpp
# Opt level: O3

void ConvexDecomposition::calcConvexDecomposition
               (uint vcount,float *vertices,uint tcount,uint *indices,
               ConvexDecompInterface *callback,float masterVolume,uint depth)

{
  float fVar1;
  VertexLookup vlook;
  ConvexDecompInterface *callback_00;
  PlaneTriResult PVar2;
  uint uVar3;
  HullError HVar4;
  float *pfVar5;
  Vector3d *p2;
  Vector3d *pVVar6;
  UintVector *list;
  VertexLookup pvVar7;
  Vector3d *p3;
  undefined4 in_register_0000008c;
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint bcount;
  uint fcount;
  UintVector ifront;
  UintVector iback;
  HullResult result;
  float plane [4];
  Vector3d front [4];
  float volume;
  uint local_1c8;
  uint local_1c4;
  VertexLookup local_1c0;
  VertexLookup local_1b8;
  UintVector local_1b0;
  undefined8 local_190;
  UintVector local_188;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  Vector3d VStack_14c;
  uint *local_140;
  Vector3d local_134;
  ConvexDecompInterface *local_120;
  float local_118 [4];
  undefined1 local_108 [16];
  uint local_f8;
  undefined1 local_f4 [8];
  undefined8 local_ec;
  Vector3d local_e4;
  ConvexResult local_d8;
  
  local_190 = CONCAT44(in_register_0000008c,depth);
  local_168._4_4_ = in_XMM0_Db;
  local_168._0_4_ = masterVolume;
  local_168._8_4_ = in_XMM0_Dc;
  local_168._12_4_ = in_XMM0_Dd;
  if (depth < MAXDEPTH) {
    fVar9 = computeConcavity(vcount,vertices,tcount,indices,callback,local_118,(float *)&local_d8);
    uVar3 = (uint)local_190;
    if (uVar3 < MAXDEPTH) {
      fVar1 = (float)((uVar3 == 0) * local_d8.mHullVcount + (uint)(uVar3 != 0) * local_168._0_4_);
      local_168 = ZEXT416((uint)fVar1);
      if (CONCAVE_PERCENT < (fVar9 * 100.0) / fVar1) {
        local_1b0.m_ownsMemory = true;
        local_1b0.m_data = (uint *)0x0;
        local_188.m_ownsMemory = true;
        local_188.m_data = (uint *)0x0;
        local_1b0.m_size = 0;
        local_1b0.m_capacity = 0;
        local_188.m_size = 0;
        local_188.m_capacity = 0;
        local_1c0 = Vl_createVertexLookup();
        local_120 = callback;
        local_1b8 = Vl_createVertexLookup();
        if (tcount != 0) {
          do {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(vertices + (ulong)(*indices * 3) + 1);
            auVar8 = vpermt2ps_avx512vl(auVar8,_DAT_009e2030,ZEXT416((uint)vertices[*indices * 3]));
            auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)vertices[indices[1] * 3]),0x30);
            auVar11._16_8_ = *(undefined8 *)(vertices + (ulong)(indices[1] * 3) + 1);
            auVar11._0_16_ = auVar8;
            auVar11._24_8_ = 0;
            auVar10._16_8_ = *(undefined8 *)(vertices + indices[2] * 3);
            auVar10._0_16_ = auVar8;
            auVar10._24_8_ = 0;
            local_d8._0_32_ = vshufpd_avx(auVar11,auVar10,2);
            local_d8.mHullVolume = vertices[(ulong)(indices[2] * 3) + 2];
            local_1c4 = 0;
            local_1c8 = 0;
            PVar2 = planeTriIntersection
                              (local_118,(float *)&local_d8,0xc,1e-05,(float *)local_108,&local_1c4,
                               (float *)local_158,&local_1c8);
            if ((4 < local_1c4) || (4 < local_1c8)) {
              PVar2 = planeTriIntersection
                                (local_118,(float *)&local_d8,0xc,1e-05,(float *)local_108,
                                 &local_1c4,(float *)local_158,&local_1c8);
            }
            pVVar6 = (Vector3d *)local_158;
            if (PVar2 == PTR_SPLIT) {
              if (1 < local_1c4 - 3) {
                __assert_fail("fcount >= 3 && fcount <= 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                              ,0x12d,
                              "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                             );
              }
              if (1 < local_1c8 - 3) {
                __assert_fail("bcount >= 3 && bcount <= 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                              ,0x12e,
                              "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                             );
              }
              addTri(local_1c0,&local_1b0,(Vector3d *)local_108,(Vector3d *)(local_108 + 0xc),
                     (Vector3d *)(local_108 + 0x18));
              addTri(local_1b8,&local_188,(Vector3d *)local_158,&VStack_14c,(Vector3d *)&local_140);
              if (local_1c4 == 4) {
                addTri(local_1c0,&local_1b0,(Vector3d *)local_108,(Vector3d *)(local_108 + 0x18),
                       &local_e4);
              }
              list = &local_188;
              p2 = (Vector3d *)&local_140;
              p3 = &local_134;
              pvVar7 = local_1b8;
              if (local_1c8 == 4) goto LAB_0090c800;
            }
            else {
              if (PVar2 == PTR_BACK) {
                list = &local_188;
                p2 = &VStack_14c;
                p3 = (Vector3d *)&local_140;
                pvVar7 = local_1b8;
                if (local_1c8 != 3) {
                  __assert_fail("bcount == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                                ,0x11f,
                                "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                               );
                }
              }
              else {
                if (PVar2 != PTR_FRONT) goto LAB_0090c805;
                list = &local_1b0;
                p2 = (Vector3d *)(local_108 + 0xc);
                p3 = (Vector3d *)(local_108 + 0x18);
                pVVar6 = (Vector3d *)local_108;
                pvVar7 = local_1c0;
                if (local_1c4 != 3) {
                  __assert_fail("fcount == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                                ,0x111,
                                "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                               );
                }
              }
LAB_0090c800:
              addTri(pvVar7,list,pVVar6,p2,p3);
            }
LAB_0090c805:
            indices = indices + 3;
            tcount = tcount - 1;
          } while (tcount != 0);
        }
        callback_00 = local_120;
        vlook = local_1b8;
        pvVar7 = local_1c0;
        if (local_1b0.m_size != 0) {
          uVar3 = Vl_getVcount(local_1c0);
          pfVar5 = Vl_getVertices(pvVar7);
          calcConvexDecomposition
                    (uVar3,pfVar5,local_1b0.m_size / 3,local_1b0.m_data,callback_00,
                     (float)local_168._0_4_,(int)local_190 + 1);
        }
        if ((local_1b0.m_data != (uint *)0x0) && (local_1b0.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(local_1b0.m_data);
        }
        local_1b0.m_ownsMemory = true;
        local_1b0.m_data = (uint *)0x0;
        local_1b0.m_size = 0;
        local_1b0.m_capacity = 0;
        Vl_releaseVertexLookup(pvVar7);
        if (local_188.m_size != 0) {
          uVar3 = Vl_getVcount(vlook);
          pfVar5 = Vl_getVertices(vlook);
          calcConvexDecomposition
                    (uVar3,pfVar5,local_188.m_size / 3,local_188.m_data,callback_00,
                     (float)local_168._0_4_,(int)local_190 + 1);
        }
        if ((local_188.m_data != (uint *)0x0) && (local_188.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(local_188.m_data);
        }
        local_188.m_ownsMemory = true;
        local_188.m_data = (uint *)0x0;
        local_188.m_size = 0;
        local_188.m_capacity = 0;
        Vl_releaseVertexLookup(vlook);
        cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_188);
        cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_1b0);
        return;
      }
    }
  }
  local_158[0] = true;
  local_158._4_4_ = 0.0;
  fStack_150 = 0.0;
  VStack_14c.x = 0.0;
  local_ec._0_4_ = 0x1000;
  local_ec._4_4_ = 0x1000;
  VStack_14c.y = 0.0;
  VStack_14c.z = 0.0;
  local_140 = (uint *)0x0;
  local_f4._0_4_ = 0.001;
  local_f4._4_4_ = 0.01;
  local_108._0_4_ = 1.4013e-45;
  local_f8 = 0xc;
  local_108._4_4_ = vcount;
  local_108._8_8_ = vertices;
  HVar4 = HullLibrary::CreateConvexHull
                    ((HullLibrary *)&local_1b0,(HullDesc *)local_108,(HullResult *)local_158);
  if (HVar4 == QE_OK) {
    ConvexResult::ConvexResult
              (&local_d8,local_158._4_4_,(float *)CONCAT44(VStack_14c.x,fStack_150),
               (uint)VStack_14c.y,local_140);
    (*callback->_vptr_ConvexDecompInterface[6])(callback,&local_d8);
    ConvexResult::~ConvexResult(&local_d8);
  }
  HullLibrary::ReleaseResult((HullLibrary *)&local_1b0,(HullResult *)local_158);
  return;
}

Assistant:

void calcConvexDecomposition(unsigned int           vcount,
                                const float           *vertices,
                                unsigned int           tcount,
                                const unsigned int    *indices,
                                ConvexDecompInterface *callback,
                                float                  masterVolume,
                                unsigned int           depth)

{

  float plane[4];

  bool split = false;


  if ( depth < MAXDEPTH )
  {

		float volume;
		float c = computeConcavity( vcount, vertices, tcount, indices, callback, plane, volume );

    if ( depth == 0 )
    {
      masterVolume = volume;
    }

		float percent = (c*100.0f)/masterVolume;

		if ( percent > CONCAVE_PERCENT ) // if great than 5% of the total volume is concave, go ahead and keep splitting.
		{
      split = true;
    }

  }

  if ( depth >= MAXDEPTH || !split )
  {

#if 1

    HullResult result;
    HullLibrary hl;
    HullDesc   desc;

  	desc.SetHullFlag(QF_TRIANGLES);

    desc.mVcount       = vcount;
    desc.mVertices     = vertices;
    desc.mVertexStride = sizeof(float)*3;

    HullError ret = hl.CreateConvexHull(desc,result);

    if ( ret == QE_OK )
    {

			ConvexResult r(result.mNumOutputVertices, result.mOutputVertices, result.mNumFaces, result.mIndices);


			callback->ConvexDecompResult(r);
    }


#else

		static unsigned int colors[8] =
		{
			0xFF0000,
		  0x00FF00,
			0x0000FF,
			0xFFFF00,
			0x00FFFF,
			0xFF00FF,
			0xFFFFFF,
			0xFF8040
		};

		static int count = 0;

		count++;

		if ( count == 8 ) count = 0;

		assert( count >= 0 && count < 8 );

		unsigned int color = colors[count];

    const unsigned int *source = indices;

    for (unsigned int i=0; i<tcount; i++)
    {

      unsigned int i1 = *source++;
      unsigned int i2 = *source++;
      unsigned int i3 = *source++;

			FaceTri t(vertices, i1, i2, i3 );

      callback->ConvexDebugTri( t.mP1.Ptr(), t.mP2.Ptr(), t.mP3.Ptr(), color );

    }
#endif

    hl.ReleaseResult (result);
    return;

  }

  UintVector ifront;
  UintVector iback;

  VertexLookup vfront = Vl_createVertexLookup();
  VertexLookup vback  = Vl_createVertexLookup();


	bool showmesh = false;
  #if SHOW_MESH
  showmesh = true;
  #endif

	if ( 0 )
	{
		showmesh = true;
	  for (float x=-1; x<1; x+=0.10f)
		{
		  for (float y=0; y<1; y+=0.10f)
			{
			  for (float z=-1; z<1; z+=0.04f)
				{
				  float d = x*plane[0] + y*plane[1] + z*plane[2] + plane[3];
					Vector3d p(x,y,z);
				  if ( d >= 0 )
					  callback->ConvexDebugPoint(p.Ptr(), 0.02f, 0x00FF00);
				  else
					  callback->ConvexDebugPoint(p.Ptr(), 0.02f, 0xFF0000);
				}
			}
		}
	}

	if ( 1 )
	{
		// ok..now we are going to 'split' all of the input triangles against this plane!
		const unsigned int *source = indices;
		for (unsigned int i=0; i<tcount; i++)
		{
			unsigned int i1 = *source++;
			unsigned int i2 = *source++;
			unsigned int i3 = *source++;

			FaceTri t(vertices, i1, i2, i3 );

			Vector3d front[4];
			Vector3d back[4];

			unsigned int fcount=0;
			unsigned int bcount=0;

			PlaneTriResult result;

		  result = planeTriIntersection(plane,t.mP1.Ptr(),sizeof(Vector3d),0.00001f,front[0].Ptr(),fcount,back[0].Ptr(),bcount );

			if( fcount > 4 || bcount > 4 )
			{
		    result = planeTriIntersection(plane,t.mP1.Ptr(),sizeof(Vector3d),0.00001f,front[0].Ptr(),fcount,back[0].Ptr(),bcount );
			}

			switch ( result )
			{
				case PTR_FRONT:

					assert( fcount == 3 );

          if ( showmesh )
            callback->ConvexDebugTri( front[0].Ptr(), front[1].Ptr(), front[2].Ptr(), 0x00FF00 );

          #if MAKE_MESH

          addTri( vfront, ifront, front[0], front[1], front[2] );


          #endif

					break;
				case PTR_BACK:
					assert( bcount == 3 );

          if ( showmesh )
  					callback->ConvexDebugTri( back[0].Ptr(), back[1].Ptr(), back[2].Ptr(), 0xFFFF00 );

          #if MAKE_MESH

          addTri( vback, iback, back[0], back[1], back[2] );

          #endif

					break;
				case PTR_SPLIT:

					assert( fcount >= 3 && fcount <= 4);
					assert( bcount >= 3 && bcount <= 4);

          #if MAKE_MESH

          addTri( vfront, ifront, front[0], front[1], front[2] );
          addTri( vback, iback, back[0], back[1], back[2] );


          if ( fcount == 4 )
          {
            addTri( vfront, ifront, front[0], front[2], front[3] );
          }

          if ( bcount == 4  )
          {
            addTri( vback, iback, back[0], back[2], back[3] );
          }

          #endif

          if ( showmesh )
          {
  					callback->ConvexDebugTri( front[0].Ptr(), front[1].Ptr(), front[2].Ptr(), 0x00D000 );
  					callback->ConvexDebugTri( back[0].Ptr(), back[1].Ptr(), back[2].Ptr(), 0xD0D000 );

  					if ( fcount == 4 )
  					{
  						callback->ConvexDebugTri( front[0].Ptr(), front[2].Ptr(), front[3].Ptr(), 0x00D000 );
  					}
  					if ( bcount == 4 )
  					{
  						callback->ConvexDebugTri( back[0].Ptr(), back[2].Ptr(), back[3].Ptr(), 0xD0D000 );
  					}
  				}

					break;
			}
		}

    // ok... here we recursively call
    if ( ifront.size() )
    {
      unsigned int vcount   = Vl_getVcount(vfront);
      const float *vertices = Vl_getVertices(vfront);
      unsigned int tcount   = ifront.size()/3;

      calcConvexDecomposition(vcount, vertices, tcount, &ifront[0], callback, masterVolume, depth+1);

    }

    ifront.clear();

    Vl_releaseVertexLookup(vfront);

    if ( iback.size() )
    {
      unsigned int vcount   = Vl_getVcount(vback);
      const float *vertices = Vl_getVertices(vback);
      unsigned int tcount   = iback.size()/3;

      calcConvexDecomposition(vcount, vertices, tcount, &iback[0], callback, masterVolume, depth+1);

    }

    iback.clear();
    Vl_releaseVertexLookup(vback);

	}
}